

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O1

void __thiscall MPEGPictureHeader::setVbvDelay(MPEGPictureHeader *this,uint16_t val)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  
  if ((this->super_MPEGRawDataHeader).m_headerIncludedToBuff == true) {
    puVar3 = (this->super_MPEGRawDataHeader).m_data_buffer;
    bVar1 = puVar3[5];
    bVar2 = puVar3[7];
    puVar3[5] = bVar1 & 0xf8;
    puVar3[5] = (byte)(this->vbv_delay >> 0xd) | bVar1 & 0xf8;
    puVar3[6] = (uint8_t)(this->vbv_delay >> 5);
    puVar3[7] = bVar2 & 7;
    puVar3[7] = (char)this->vbv_delay << 3 | bVar2 & 7;
    return;
  }
  this->vbv_delay = val;
  return;
}

Assistant:

void MPEGPictureHeader::setVbvDelay(const uint16_t val)
{
    if (m_headerIncludedToBuff)
    {
        uint8_t* vbv_delay_ptr = &m_data_buffer[5];  // skip sequence header and 1-st byte of ref
        vbv_delay_ptr[0] &= 0xF8;
        vbv_delay_ptr[0] |= vbv_delay >> 13;
        vbv_delay_ptr[1] = static_cast<uint8_t>(vbv_delay >> 5);
        vbv_delay_ptr[2] &= 0x07;
        vbv_delay_ptr[2] |= vbv_delay << 3;
    }
    else
        vbv_delay = val;
}